

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Switch(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this)

{
  size_type t_match_start;
  bool bVar1;
  eval_error *peVar2;
  element_type *peVar3;
  allocator<char> local_129;
  string local_128;
  undefined1 local_105;
  File_Position local_104;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d5;
  File_Position local_d4;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a5;
  File_Position local_a4;
  allocator<char> local_99;
  string local_98;
  undefined1 local_75;
  File_Position local_74;
  allocator<char> local_69;
  string local_68;
  Static_String local_38;
  size_type local_28;
  size_type prev_stack_top;
  Depth_Counter dc;
  ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser = this;
  Depth_Counter::Depth_Counter((Depth_Counter *)&prev_stack_top,this);
  local_28 = Catch::clara::std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
             ::size(&this->m_match_stack);
  utility::Static_String::Static_String<7ul>(&local_38,(char (*) [7])"switch");
  bVar1 = Keyword(this,&local_38);
  if (bVar1) {
    bVar1 = Char(this,'(');
    if (!bVar1) {
      local_75 = 1;
      peVar2 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Incomplete \'switch\' expression",&local_69);
      File_Position::File_Position(&local_74,(this->m_position).line,(this->m_position).col);
      peVar3 = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar2,&local_68,&local_74,peVar3);
      local_75 = 0;
      __cxa_throw(peVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    bVar1 = Operator(this,0);
    if ((!bVar1) || (bVar1 = Char(this,')'), !bVar1)) {
      local_a5 = 1;
      peVar2 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Incomplete \'switch\' expression",&local_99);
      File_Position::File_Position(&local_a4,(this->m_position).line,(this->m_position).col);
      peVar3 = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar2,&local_98,&local_a4,peVar3);
      local_a5 = 0;
      __cxa_throw(peVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    do {
      bVar1 = Eol(this);
    } while (bVar1);
    bVar1 = Char(this,'{');
    if (!bVar1) {
      local_105 = 1;
      peVar2 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Incomplete block",&local_f9);
      File_Position::File_Position(&local_104,(this->m_position).line,(this->m_position).col);
      peVar3 = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar2,&local_f8,&local_104,peVar3);
      local_105 = 0;
      __cxa_throw(peVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    do {
      bVar1 = Eol(this);
    } while (bVar1);
    while (bVar1 = Case(this), bVar1) {
      do {
        bVar1 = Eol(this);
      } while (bVar1);
    }
    do {
      bVar1 = Eol(this);
    } while (bVar1);
    bVar1 = Char(this,'}');
    t_match_start = local_28;
    if (!bVar1) {
      local_d5 = 1;
      peVar2 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"Incomplete block",&local_c9);
      File_Position::File_Position(&local_d4,(this->m_position).line,(this->m_position).col);
      peVar3 = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar2,&local_c8,&local_d4,peVar3);
      local_d5 = 0;
      __cxa_throw(peVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::build_match<chaiscript::eval::Switch_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)this,t_match_start,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  Depth_Counter::~Depth_Counter((Depth_Counter *)&prev_stack_top);
  return this_local._7_1_;
}

Assistant:

bool Switch() {
        Depth_Counter dc{this};
        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("switch")) {
          if (!Char('(')) {
            throw exception::eval_error("Incomplete 'switch' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          if (!(Operator() && Char(')'))) {
            throw exception::eval_error("Incomplete 'switch' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          while (Eol()) {
          }

          if (Char('{')) {
            while (Eol()) {
            }

            while (Case()) {
              while (Eol()) {
              } // eat
            }

            while (Eol()) {
            } // eat

            if (!Char('}')) {
              throw exception::eval_error("Incomplete block", File_Position(m_position.line, m_position.col), *m_filename);
            }
          } else {
            throw exception::eval_error("Incomplete block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Switch_AST_Node<Tracer>>(prev_stack_top);
          return true;

        } else {
          return false;
        }
      }